

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O2

Value * DumpTarget(Value *__return_storage_ptr__,cmGeneratorTarget *target,string *config)

{
  _Rb_tree_node_base *__k;
  undefined1 *__k_00;
  cmMakefile *pcVar1;
  cmSourceFile *this;
  string *psVar2;
  size_type sVar3;
  pointer ppcVar4;
  undefined1 uVar5;
  pointer pbVar6;
  pointer ppcVar7;
  bool bVar8;
  __type _Var9;
  TargetType targetType;
  cmLocalGenerator *pcVar10;
  char *pcVar11;
  Value *pVVar12;
  string *psVar13;
  cmInstallTargetGenerator *this_00;
  OutputInfo *pOVar14;
  mapped_type *pmVar15;
  _Base_ptr p_Var16;
  pointer ppcVar17;
  mapped_type *this_01;
  undefined8 uVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in;
  pointer ppcVar19;
  string *value;
  string *psVar20;
  string *i;
  _Alloc_hider _Var21;
  pointer dir;
  const_iterator cVar22;
  const_iterator cVar23;
  string dest;
  __node_base_ptr p_Stack_668;
  string installPath;
  Value installPaths;
  _Alloc_hider local_608;
  cmOutputConverter *local_600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  pointer local_5e8;
  pointer pbStack_5e0;
  pointer local_5d8;
  pointer ppStack_5d0;
  const_iterator local_5c8;
  pointer ppStack_5c0;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> targetGenerators;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string COMPILE_OPTIONS;
  string linkPath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
  languageDataMap;
  Value local_4e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  Value ttl;
  string COMPILE_DEFINITIONS;
  string installPrefix;
  string INCLUDE_DIRECTORIES;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  Value sourceGroupsValue;
  string defPropName;
  string typeName;
  Value local_318;
  Value local_2f0;
  Value local_2c8;
  Value local_2a0;
  Value local_278;
  Value local_250;
  Value local_228;
  Value local_200;
  Value local_1d8;
  Value local_1b0;
  Value local_188;
  Value local_160;
  Value local_138;
  Value local_110;
  Value local_e8;
  Value local_c0;
  Value local_98;
  string local_70;
  string local_50;
  
  pcVar10 = cmGeneratorTarget::GetLocalGenerator(target);
  targetType = cmGeneratorTarget::GetType(target);
  pcVar11 = cmState::GetTargetTypeName(targetType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&typeName,pcVar11,(allocator<char> *)&installPaths);
  Json::Value::Value(&ttl,arrayValue);
  Json::Value::Value(&installPaths,"EXECUTABLE");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"STATIC_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"SHARED_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"MODULE_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"OBJECT_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"UTILITY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  Json::Value::Value(&installPaths,"INTERFACE_LIBRARY");
  Json::Value::append(&ttl,&installPaths);
  Json::Value::~Value(&installPaths);
  bVar8 = Json::Value::isNull(&ttl);
  if (!bVar8) {
    cVar22 = Json::Value::begin(&ttl);
    cVar23 = Json::Value::end(&ttl);
    std::__cxx11::string::string((string *)&targetGenerators,(string *)&typeName);
    std::__cxx11::string::string((string *)&languageDataMap,(string *)&targetGenerators);
    COMPILE_DEFINITIONS._M_dataplus._M_p =
         (pointer)cVar23.super_ValueIteratorBase.current_._M_node._M_node;
    COMPILE_DEFINITIONS._M_string_length._0_1_ = cVar23.super_ValueIteratorBase.isNull_;
    std::__cxx11::string::string((string *)&languages,(string *)&languageDataMap);
    std::__cxx11::string::string((string *)&installPath,(string *)&languages);
    std::__cxx11::string::string((string *)&installPaths,(string *)&installPath);
    std::__cxx11::string::string((string *)&dest,(string *)&installPaths);
    std::__cxx11::string::~string((string *)&installPaths);
    std::__cxx11::string::string((string *)&installPrefix,(string *)&dest);
    COMPILE_OPTIONS._M_string_length._0_1_ = cVar22.super_ValueIteratorBase.isNull_;
    COMPILE_OPTIONS._M_dataplus._M_p =
         (pointer)cVar22.super_ValueIteratorBase.current_._M_node._M_node;
    INCLUDE_DIRECTORIES._M_dataplus._M_p =
         (pointer)cVar23.super_ValueIteratorBase.current_._M_node._M_node;
    INCLUDE_DIRECTORIES._M_string_length._0_1_ = cVar23.super_ValueIteratorBase.isNull_;
    while( true ) {
      bVar8 = Json::ValueIteratorBase::operator!=
                        ((ValueIteratorBase *)&COMPILE_OPTIONS,(SelfType *)&INCLUDE_DIRECTORIES);
      if (!bVar8) break;
      linkPath._M_dataplus = COMPILE_OPTIONS._M_dataplus;
      linkPath._M_string_length =
           CONCAT71(linkPath._M_string_length._1_7_,(undefined1)COMPILE_OPTIONS._M_string_length);
      pVVar12 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&linkPath);
      Json::Value::asString_abi_cxx11_((string *)&installPaths,pVVar12);
      _Var9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &installPaths,&installPrefix);
      std::__cxx11::string::~string((string *)&installPaths);
      if (_Var9) break;
      Json::ValueIteratorBase::increment((ValueIteratorBase *)&COMPILE_OPTIONS);
    }
    uVar5 = (undefined1)COMPILE_OPTIONS._M_string_length;
    _Var21._M_p = COMPILE_OPTIONS._M_dataplus._M_p;
    std::__cxx11::string::~string((string *)&installPrefix);
    std::__cxx11::string::~string((string *)&dest);
    std::__cxx11::string::~string((string *)&installPath);
    defPropName._M_dataplus = _Var21;
    defPropName._M_string_length._0_1_ = uVar5;
    bVar8 = Json::ValueIteratorBase::isEqual
                      ((ValueIteratorBase *)&COMPILE_DEFINITIONS,(SelfType *)&defPropName);
    std::__cxx11::string::~string((string *)&languages);
    std::__cxx11::string::~string((string *)&languageDataMap);
    std::__cxx11::string::~string((string *)&targetGenerators);
    if (!bVar8) {
      bVar8 = cmGeneratorTarget::IsImported(target);
      if (!bVar8) {
        Json::Value::Value(__return_storage_ptr__,objectValue);
        psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        Json::Value::Value(&local_98,psVar13);
        pVVar12 = Json::Value::operator[](__return_storage_ptr__,&kNAME_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar12,&local_98);
        Json::Value::~Value(&local_98);
        bVar8 = cmTarget::GetIsGeneratorProvided(target->Target);
        Json::Value::Value(&local_c0,bVar8);
        pVVar12 = Json::Value::operator[]
                            (__return_storage_ptr__,&kIS_GENERATOR_PROVIDED_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar12,&local_c0);
        Json::Value::~Value(&local_c0);
        Json::Value::Value(&local_e8,&typeName);
        pVVar12 = Json::Value::operator[](__return_storage_ptr__,&kTYPE_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar12,&local_e8);
        Json::Value::~Value(&local_e8);
        psVar13 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar10);
        Json::Value::Value(&local_110,psVar13);
        pVVar12 = Json::Value::operator[](__return_storage_ptr__,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar12,&local_110);
        Json::Value::~Value(&local_110);
        psVar13 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar10);
        Json::Value::Value(&local_138,psVar13);
        pVVar12 = Json::Value::operator[](__return_storage_ptr__,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar12,&local_138);
        Json::Value::~Value(&local_138);
        if (targetType != INTERFACE_LIBRARY) {
          cmGeneratorTarget::GetFullName
                    ((string *)&installPaths,target,config,RuntimeBinaryArtifact);
          Json::Value::Value(&local_160,(string *)&installPaths);
          pVVar12 = Json::Value::operator[](__return_storage_ptr__,&kFULL_NAME_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar12,&local_160);
          Json::Value::~Value(&local_160);
          std::__cxx11::string::~string((string *)&installPaths);
          bVar8 = cmTarget::GetHaveInstallRule(target->Target);
          if (bVar8) {
            Json::Value::Value(&local_188,true);
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,&kHAS_INSTALL_RULE_abi_cxx11_);
            Json::Value::operator=(pVVar12,&local_188);
            Json::Value::~Value(&local_188);
            Json::Value::Value(&installPaths,arrayValue);
            std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::vector
                      (&targetGenerators,&target->Makefile->InstallGenerators);
            ppcVar4 = targetGenerators.
                      super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppcVar19 = targetGenerators.
                            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppcVar19 != ppcVar4;
                ppcVar19 = ppcVar19 + 1) {
              if (*ppcVar19 != (cmInstallGenerator *)0x0) {
                this_00 = (cmInstallTargetGenerator *)
                          __dynamic_cast(*ppcVar19,&cmInstallGenerator::typeinfo,
                                         &cmInstallTargetGenerator::typeinfo);
                if ((this_00 != (cmInstallTargetGenerator *)0x0) &&
                   (this_00->Target->Target == target->Target)) {
                  cmInstallTargetGenerator::GetDestination(&dest,this_00,config);
                  installPath._M_dataplus._M_p = (pointer)&installPath.field_2;
                  installPath._M_string_length = 0;
                  installPath.field_2._M_allocated_capacity =
                       installPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  if (dest._M_string_length == 0) {
LAB_003246cb:
                    pcVar1 = target->Makefile;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&languages,"CMAKE_INSTALL_PREFIX",
                               (allocator<char> *)&languageDataMap);
                    psVar13 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&languages);
                    std::__cxx11::string::string((string *)&installPrefix,(string *)psVar13);
                    std::__cxx11::string::~string((string *)&languages);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&languageDataMap,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&installPrefix,'/');
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&languages,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&languageDataMap,&dest);
                    std::__cxx11::string::operator=((string *)&installPath,(string *)&languages);
                    std::__cxx11::string::~string((string *)&languages);
                    std::__cxx11::string::~string((string *)&languageDataMap);
                    std::__cxx11::string::~string((string *)&installPrefix);
                  }
                  else {
                    bVar8 = cmsys::SystemTools::FileIsFullPath(&dest);
                    if (!bVar8) goto LAB_003246cb;
                    std::__cxx11::string::_M_assign((string *)&installPath);
                  }
                  Json::Value::Value((Value *)&installPrefix,&installPath);
                  Json::Value::append(&installPaths,(Value *)&installPrefix);
                  Json::Value::~Value((Value *)&installPrefix);
                  std::__cxx11::string::~string((string *)&installPath);
                  std::__cxx11::string::~string((string *)&dest);
                }
              }
            }
            Json::Value::Value(&local_1b0,&installPaths);
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,&kINSTALL_PATHS_abi_cxx11_);
            Json::Value::operator=(pVVar12,&local_1b0);
            Json::Value::~Value(&local_1b0);
            std::_Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::
            ~_Vector_base(&targetGenerators.
                           super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                         );
            Json::Value::~Value(&installPaths);
          }
          bVar8 = cmGeneratorTarget::HaveWellDefinedOutputFiles(target);
          if (bVar8) {
            Json::Value::Value((Value *)&installPrefix,arrayValue);
            cmGeneratorTarget::GetFullPath(&dest,target,config,RuntimeBinaryArtifact,false);
            Json::Value::Value(&installPaths,&dest);
            Json::Value::append((Value *)&installPrefix,&installPaths);
            Json::Value::~Value(&installPaths);
            std::__cxx11::string::~string((string *)&dest);
            bVar8 = cmGeneratorTarget::IsDLLPlatform(target);
            if (bVar8) {
              cmGeneratorTarget::GetFullPath(&dest,target,config,ImportLibraryArtifact,false);
              Json::Value::Value(&installPaths,&dest);
              Json::Value::append((Value *)&installPrefix,&installPaths);
              Json::Value::~Value(&installPaths);
              std::__cxx11::string::~string((string *)&dest);
              pOVar14 = cmGeneratorTarget::GetOutputInfo(target,config);
              if ((pOVar14 != (OutputInfo *)0x0) && ((pOVar14->PdbDir)._M_string_length != 0)) {
                std::operator+(&installPath,&pOVar14->PdbDir,'/');
                cmGeneratorTarget::GetPDBName((string *)&languages,target,config);
                std::operator+(&dest,&installPath,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &languages);
                Json::Value::Value(&installPaths,&dest);
                Json::Value::append((Value *)&installPrefix,&installPaths);
                Json::Value::~Value(&installPaths);
                std::__cxx11::string::~string((string *)&dest);
                std::__cxx11::string::~string((string *)&languages);
                std::__cxx11::string::~string((string *)&installPath);
              }
            }
            Json::Value::Value(&local_1d8,(Value *)&installPrefix);
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,&kARTIFACTS_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar12,&local_1d8);
            Json::Value::~Value(&local_1d8);
            cmGeneratorTarget::GetLinkerLanguage((string *)&installPaths,target,config);
            Json::Value::Value(&local_200,(string *)&installPaths);
            pVVar12 = Json::Value::operator[]
                                (__return_storage_ptr__,&kLINKER_LANGUAGE_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar12,&local_200);
            Json::Value::~Value(&local_200);
            std::__cxx11::string::~string((string *)&installPaths);
            installPath._M_dataplus._M_p = (pointer)&installPath.field_2;
            installPath._M_string_length = 0;
            languages._M_t._M_impl._0_8_ =
                 &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            languages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            languages._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            installPath.field_2._M_allocated_capacity =
                 installPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
            languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)
                 ((ulong)languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
                 0xffffffffffffff00);
            languageDataMap._M_t._M_impl._0_8_ =
                 &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            targetGenerators.
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&targetGenerators.
                           super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            targetGenerators.
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)
                 ((ulong)languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
                 0xffffffffffffff00);
            targetGenerators.
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
            linkPath._M_string_length = 0;
            linkPath.field_2._M_local_buf[0] = '\0';
            cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&COMPILE_OPTIONS,pcVar10);
            cmStateSnapshot::GetDirectory
                      ((cmStateDirectory *)&dest,(cmStateSnapshot *)&COMPILE_OPTIONS);
            cmLinkLineComputer::cmLinkLineComputer
                      ((cmLinkLineComputer *)&installPaths,&pcVar10->super_cmOutputConverter,
                       (cmStateDirectory *)&dest);
            cmLocalGenerator::GetTargetFlags
                      (pcVar10,(cmLinkLineComputer *)&installPaths,config,&installPath,
                       (string *)&languageDataMap,(string *)&languages,(string *)&targetGenerators,
                       &linkPath,target);
            cmSystemTools::TrimWhitespace(&dest,&installPath);
            std::__cxx11::string::operator=((string *)&installPath,(string *)&dest);
            std::__cxx11::string::~string((string *)&dest);
            cmSystemTools::TrimWhitespace(&dest,(string *)&languages);
            std::__cxx11::string::operator=((string *)&languages,(string *)&dest);
            std::__cxx11::string::~string((string *)&dest);
            cmSystemTools::TrimWhitespace(&dest,(string *)&languageDataMap);
            std::__cxx11::string::operator=((string *)&languageDataMap,(string *)&dest);
            std::__cxx11::string::~string((string *)&dest);
            cmSystemTools::TrimWhitespace(&dest,(string *)&targetGenerators);
            std::__cxx11::string::operator=((string *)&targetGenerators,(string *)&dest);
            std::__cxx11::string::~string((string *)&dest);
            cmSystemTools::TrimWhitespace(&dest,&linkPath);
            std::__cxx11::string::operator=((string *)&linkPath,(string *)&dest);
            std::__cxx11::string::~string((string *)&dest);
            cmSystemTools::TrimWhitespace(&dest,&installPath);
            sVar3 = dest._M_string_length;
            std::__cxx11::string::~string((string *)&dest);
            if (sVar3 != 0) {
              Json::Value::Value(&local_228,&installPath);
              pVVar12 = Json::Value::operator[]
                                  (__return_storage_ptr__,&kLINK_LIBRARIES_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar12,&local_228);
              Json::Value::~Value(&local_228);
            }
            cmSystemTools::TrimWhitespace(&dest,(string *)&languages);
            sVar3 = dest._M_string_length;
            std::__cxx11::string::~string((string *)&dest);
            if (sVar3 != 0) {
              Json::Value::Value(&local_250,(string *)&languages);
              pVVar12 = Json::Value::operator[](__return_storage_ptr__,&kLINK_FLAGS_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar12,&local_250);
              Json::Value::~Value(&local_250);
            }
            cmSystemTools::TrimWhitespace(&dest,(string *)&languageDataMap);
            sVar3 = dest._M_string_length;
            std::__cxx11::string::~string((string *)&dest);
            if (sVar3 != 0) {
              Json::Value::Value(&local_278,(string *)&languageDataMap);
              pVVar12 = Json::Value::operator[]
                                  (__return_storage_ptr__,&kLINK_LANGUAGE_FLAGS_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar12,&local_278);
              Json::Value::~Value(&local_278);
            }
            if (targetGenerators.
                super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
              Json::Value::Value(&local_2a0,(string *)&targetGenerators);
              pVVar12 = Json::Value::operator[]
                                  (__return_storage_ptr__,&kFRAMEWORK_PATH_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar12,&local_2a0);
              Json::Value::~Value(&local_2a0);
            }
            if (linkPath._M_string_length != 0) {
              Json::Value::Value(&local_2c8,&linkPath);
              pVVar12 = Json::Value::operator[](__return_storage_ptr__,&kLINK_PATH_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar12,&local_2c8);
              Json::Value::~Value(&local_2c8);
            }
            pcVar1 = pcVar10->Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&COMPILE_OPTIONS,"CMAKE_SYSROOT",
                       (allocator<char> *)&INCLUDE_DIRECTORIES);
            psVar13 = cmMakefile::GetSafeDefinition(pcVar1,&COMPILE_OPTIONS);
            std::__cxx11::string::string((string *)&dest,(string *)psVar13);
            std::__cxx11::string::~string((string *)&COMPILE_OPTIONS);
            if (dest._M_string_length != 0) {
              Json::Value::Value(&local_2f0,&dest);
              pVVar12 = Json::Value::operator[](__return_storage_ptr__,&kSYSROOT_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar12,&local_2f0);
              Json::Value::~Value(&local_2f0);
            }
            std::__cxx11::string::~string((string *)&dest);
            cmLinkLineComputer::~cmLinkLineComputer((cmLinkLineComputer *)&installPaths);
            std::__cxx11::string::~string((string *)&linkPath);
            std::__cxx11::string::~string((string *)&targetGenerators);
            std::__cxx11::string::~string((string *)&languageDataMap);
            std::__cxx11::string::~string((string *)&languages);
            std::__cxx11::string::~string((string *)&installPath);
            Json::Value::~Value((Value *)&installPrefix);
          }
          languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &languages._M_t._M_impl.super__Rb_tree_header._M_header;
          languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          languages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          languages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          cmGeneratorTarget::GetLanguages(target,&languages,config);
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
               0xffffffff00000000;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (p_Var16 = languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var16 != &languages._M_t._M_impl.super__Rb_tree_header;
              p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
            __k = p_Var16 + 1;
            pmVar15 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                      ::operator[](&languageDataMap,(key_type *)__k);
            std::__cxx11::string::_M_assign((string *)&pmVar15->Language);
            cmLocalGenerator::GetTargetCompileFlags
                      (pcVar10,target,config,(string *)__k,&pmVar15->Flags);
            installPaths._8_8_ = installPaths._8_8_ & 0xffffffff00000000;
            installPaths.comments_ = (CommentInfo *)0x0;
            installPaths.start_ = (ptrdiff_t)&installPaths.field_0x8;
            local_608._M_p = (pointer)0x0;
            installPaths.limit_ = installPaths.start_;
            cmLocalGenerator::GetTargetDefines
                      (pcVar10,target,config,(string *)__k,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&installPaths);
            LanguageData::SetDefines
                      (pmVar15,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&installPaths);
            installPrefix._M_dataplus._M_p = (pointer)0x0;
            installPrefix._M_string_length = 0;
            installPrefix.field_2._M_allocated_capacity = 0;
            cmLocalGenerator::GetIncludeDirectories
                      (pcVar10,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&installPrefix,target,(string *)__k,config);
            sVar3 = installPrefix._M_string_length;
            for (_Var21 = installPrefix._M_dataplus; _Var21._M_p != (pointer)sVar3;
                _Var21._M_p = _Var21._M_p + 0x20) {
              bVar8 = cmGeneratorTarget::IsSystemIncludeDirectory
                                (target,(string *)_Var21._M_p,config,(string *)__k);
              dest._M_dataplus._M_p._0_1_ = bVar8;
              std::
              vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
              ::emplace_back<std::__cxx11::string_const&,bool>
                        ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                          *)&pmVar15->IncludePathList,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Var21._M_p,(bool *)&dest);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&installPrefix);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&installPaths);
          }
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmGeneratorTarget::GetSourceFiles(target,&files,config);
          ppcVar7 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          dest._M_dataplus._M_p = (pointer)&p_Stack_668;
          dest._M_string_length = 1;
          dest.field_2._M_allocated_capacity = 0;
          dest.field_2._8_8_ = 0;
          p_Stack_668 = (__node_base_ptr)0x0;
          __k_00 = &installPaths.field_0x8;
          for (ppcVar17 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start; ppcVar17 != ppcVar7;
              ppcVar17 = ppcVar17 + 1) {
            this = *ppcVar17;
            installPaths.value_.bool_ = false;
            installPaths._8_8_ = &installPaths.start_;
            installPaths.comments_ = (CommentInfo *)0x0;
            installPaths.start_ = installPaths.start_ & 0xffffffffffffff00;
            local_608._M_p = (pointer)&local_5f8;
            local_600 = (cmOutputConverter *)0x0;
            local_5f8._M_local_buf[0] = false;
            local_5c8._M_current =
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                  *)0x0;
            ppStack_5c0 = (pointer)0x0;
            local_5d8 = (pointer)0x0;
            ppStack_5d0 = (pointer)0x0;
            local_5e8 = (pointer)0x0;
            pbStack_5e0 = (pointer)0x0;
            cmSourceFile::GetLanguage_abi_cxx11_(&installPrefix,this);
            std::__cxx11::string::operator=((string *)__k_00,(string *)&installPrefix);
            std::__cxx11::string::~string((string *)&installPrefix);
            if (installPaths.comments_ != (CommentInfo *)0x0) {
              pmVar15 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                        ::at(&languageDataMap,(key_type *)__k_00);
              pcVar10 = cmGeneratorTarget::GetLocalGenerator(target);
              std::__cxx11::string::string((string *)&local_70,(string *)config);
              std::__cxx11::string::string((string *)&local_50,(string *)__k_00);
              cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                        ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar10,&local_70,target
                         ,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::string((string *)&targetGenerators,(string *)&pmVar15->Flags);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&linkPath,"COMPILE_FLAGS",(allocator<char> *)&installPath);
              pcVar11 = cmSourceFile::GetProperty(this,&linkPath);
              if (pcVar11 != (char *)0x0) {
                psVar13 = cmGeneratorExpressionInterpreter::Evaluate
                                    ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar11,
                                     &linkPath);
                (*pcVar10->_vptr_cmLocalGenerator[6])(pcVar10,&targetGenerators,psVar13);
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&COMPILE_OPTIONS,"COMPILE_OPTIONS",
                         (allocator<char> *)&installPath);
              pcVar11 = cmSourceFile::GetProperty(this,&COMPILE_OPTIONS);
              if (pcVar11 != (char *)0x0) {
                psVar13 = cmGeneratorExpressionInterpreter::Evaluate
                                    ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar11,
                                     &COMPILE_OPTIONS);
                cmLocalGenerator::AppendCompileOptions
                          (pcVar10,(string *)&targetGenerators,psVar13,(char *)0x0);
              }
              std::__cxx11::string::_M_assign((string *)&local_608);
              includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&INCLUDE_DIRECTORIES,"INCLUDE_DIRECTORIES",
                         (allocator<char> *)&installPath);
              pcVar11 = cmSourceFile::GetProperty(this,&INCLUDE_DIRECTORIES);
              if (pcVar11 != (char *)0x0) {
                psVar13 = cmGeneratorExpressionInterpreter::Evaluate
                                    ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar11,
                                     &INCLUDE_DIRECTORIES);
                cmLocalGenerator::AppendIncludeDirectories(pcVar10,&includes,psVar13,this);
                pbVar6 = includes.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (dir = includes.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; dir != pbVar6; dir = dir + 1)
                {
                  bVar8 = cmGeneratorTarget::IsSystemIncludeDirectory
                                    (target,dir,config,(string *)__k_00);
                  installPath._M_dataplus._M_p._0_1_ = bVar8;
                  std::
                  vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                  ::emplace_back<std::__cxx11::string_const&,bool>
                            ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                              *)&ppStack_5d0,dir,(bool *)&installPath);
                }
              }
              std::
              vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
              ::
              insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,bool>const*,std::vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>>,void>
                        ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                          *)&ppStack_5d0,local_5c8,
                         (pmVar15->IncludePathList).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pmVar15->IncludePathList).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&COMPILE_DEFINITIONS,"COMPILE_DEFINITIONS",
                         (allocator<char> *)&installPath);
              installPath._M_string_length = installPath._M_string_length & 0xffffffff00000000;
              installPath.field_2._M_allocated_capacity = 0;
              installPath.field_2._8_8_ = &installPath._M_string_length;
              pcVar11 = cmSourceFile::GetProperty(this,&COMPILE_DEFINITIONS);
              if (pcVar11 != (char *)0x0) {
                psVar13 = cmGeneratorExpressionInterpreter::Evaluate
                                    ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar11,
                                     &COMPILE_DEFINITIONS);
                cmLocalGenerator::AppendDefines
                          (pcVar10,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&installPath,psVar13);
              }
              cmsys::SystemTools::UpperCase((string *)&local_4e0,config);
              std::operator+(&defPropName,"COMPILE_DEFINITIONS_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_4e0);
              std::__cxx11::string::~string((string *)&local_4e0);
              pcVar11 = cmSourceFile::GetProperty(this,&defPropName);
              if (pcVar11 != (char *)0x0) {
                psVar13 = cmGeneratorExpressionInterpreter::Evaluate
                                    ((cmGeneratorExpressionInterpreter *)&installPrefix,pcVar11,
                                     &COMPILE_DEFINITIONS);
                cmLocalGenerator::AppendDefines
                          (pcVar10,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&installPath,psVar13);
              }
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::
              _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&installPath,
                         (pmVar15->Defines).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pmVar15->Defines).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              LanguageData::SetDefines
                        ((LanguageData *)&installPaths,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&installPath);
              std::__cxx11::string::~string((string *)&defPropName);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&installPath);
              std::__cxx11::string::~string((string *)&COMPILE_DEFINITIONS);
              std::__cxx11::string::~string((string *)&INCLUDE_DIRECTORIES);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&includes);
              std::__cxx11::string::~string((string *)&COMPILE_OPTIONS);
              std::__cxx11::string::~string((string *)&linkPath);
              std::__cxx11::string::~string((string *)&targetGenerators);
              cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
                        ((cmGeneratorExpressionInterpreter *)&installPrefix);
            }
            installPaths.value_.bool_ = this->IsGenerated;
            this_01 = std::__detail::
                      _Map_base<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&dest,(key_type *)&installPaths);
            psVar13 = cmSourceFile::GetFullPath(this,(string *)0x0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(this_01,psVar13);
            LanguageData::~LanguageData((LanguageData *)&installPaths);
          }
          psVar13 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(target->Makefile);
          Json::Value::Value(&sourceGroupsValue,arrayValue);
          for (uVar18 = dest.field_2._M_allocated_capacity;
              (undefined8 *)uVar18 != (undefined8 *)0x0; uVar18 = *(undefined8 *)uVar18) {
            Json::Value::Value(&local_4e0,objectValue);
            if (*(long *)(uVar18 + 0x18) != 0) {
              Json::Value::Value(&installPaths,(string *)(uVar18 + 0x10));
              pVVar12 = Json::Value::operator[](&local_4e0,&kLANGUAGE_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar12,&installPaths);
              Json::Value::~Value(&installPaths);
              in = extraout_RDX;
              if (*(long *)(uVar18 + 0x38) != 0) {
                Json::Value::Value((Value *)&installPrefix,(string *)(uVar18 + 0x30));
                pVVar12 = Json::Value::operator[](&local_4e0,&kCOMPILE_FLAGS_KEY_abi_cxx11_);
                Json::Value::operator=(pVVar12,(Value *)&installPrefix);
                Json::Value::~Value((Value *)&installPrefix);
                in = extraout_RDX_00;
              }
              if (*(long *)(uVar18 + 0x68) != *(long *)(uVar18 + 0x70)) {
                Json::Value::Value((Value *)&installPath,arrayValue);
                psVar2 = *(string **)(uVar18 + 0x70);
                for (psVar20 = *(string **)(uVar18 + 0x68); psVar20 != psVar2;
                    psVar20 = (string *)&psVar20[1]._M_string_length) {
                  Json::Value::Value((Value *)&targetGenerators,objectValue);
                  Json::Value::Value((Value *)&linkPath,psVar20);
                  pVVar12 = Json::Value::operator[]
                                      ((Value *)&targetGenerators,&kPATH_KEY_abi_cxx11_);
                  Json::Value::operator=(pVVar12,(Value *)&linkPath);
                  Json::Value::~Value((Value *)&linkPath);
                  if (*(char *)&psVar20[1]._M_dataplus._M_p == '\x01') {
                    Json::Value::Value((Value *)&COMPILE_OPTIONS,true);
                    pVVar12 = Json::Value::operator[]
                                        ((Value *)&targetGenerators,&kIS_SYSTEM_KEY_abi_cxx11_);
                    Json::Value::operator=(pVVar12,(Value *)&COMPILE_OPTIONS);
                    Json::Value::~Value((Value *)&COMPILE_OPTIONS);
                  }
                  Json::Value::append((Value *)&installPath,(Value *)&targetGenerators);
                  Json::Value::~Value((Value *)&targetGenerators);
                }
                Json::Value::Value((Value *)&targetGenerators,(Value *)&installPath);
                pVVar12 = Json::Value::operator[](&local_4e0,&kINCLUDE_PATH_KEY_abi_cxx11_);
                Json::Value::operator=(pVVar12,(Value *)&targetGenerators);
                Json::Value::~Value((Value *)&targetGenerators);
                Json::Value::~Value((Value *)&installPath);
                in = extraout_RDX_01;
              }
              if (*(long *)(uVar18 + 0x50) != *(long *)(uVar18 + 0x58)) {
                (anonymous_namespace)::
                fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((Value *)&installPath,(_anonymous_namespace_ *)(uVar18 + 0x50),in);
                pVVar12 = Json::Value::operator[](&local_4e0,&kDEFINES_KEY_abi_cxx11_);
                Json::Value::operator=(pVVar12,(Value *)&installPath);
                Json::Value::~Value((Value *)&installPath);
              }
            }
            Json::Value::Value((Value *)&INCLUDE_DIRECTORIES,*(bool *)(uVar18 + 8));
            pVVar12 = Json::Value::operator[](&local_4e0,&kIS_GENERATED_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar12,(Value *)&INCLUDE_DIRECTORIES);
            Json::Value::~Value((Value *)&INCLUDE_DIRECTORIES);
            Json::Value::Value((Value *)&COMPILE_DEFINITIONS,arrayValue);
            psVar2 = *(string **)(uVar18 + 0x88);
            for (psVar20 = *(string **)(uVar18 + 0x80); psVar20 != psVar2; psVar20 = psVar20 + 1) {
              cmSystemTools::RelativePath((string *)&includes,psVar13,psVar20);
              value = (string *)&includes;
              if ((pointer)psVar20->_M_string_length <=
                  includes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                value = psVar20;
              }
              Json::Value::Value((Value *)&defPropName,value);
              Json::Value::append((Value *)&COMPILE_DEFINITIONS,(Value *)&defPropName);
              Json::Value::~Value((Value *)&defPropName);
              std::__cxx11::string::~string((string *)&includes);
            }
            Json::Value::Value((Value *)&defPropName,(Value *)&COMPILE_DEFINITIONS);
            pVVar12 = Json::Value::operator[](&local_4e0,&kSOURCES_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar12,(Value *)&defPropName);
            Json::Value::~Value((Value *)&defPropName);
            Json::Value::~Value((Value *)&COMPILE_DEFINITIONS);
            bVar8 = Json::Value::isNull(&local_4e0);
            if (!bVar8) {
              Json::Value::append(&sourceGroupsValue,&local_4e0);
            }
            Json::Value::~Value(&local_4e0);
          }
          std::
          _Hashtable<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&dest);
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
          bVar8 = Json::Value::empty(&sourceGroupsValue);
          if (!bVar8) {
            Json::Value::Value(&local_318,&sourceGroupsValue);
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,&kFILE_GROUPS_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar12,&local_318);
            Json::Value::~Value(&local_318);
          }
          Json::Value::~Value(&sourceGroupsValue);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
          ::~_Rb_tree(&languageDataMap._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&languages._M_t);
        }
        goto LAB_00324381;
      }
    }
  }
  Json::Value::Value(__return_storage_ptr__,nullValue);
LAB_00324381:
  Json::Value::~Value(&ttl);
  std::__cxx11::string::~string((string *)&typeName);
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpTarget(cmGeneratorTarget* target,
                              const std::string& config)
{
  cmLocalGenerator* lg = target->GetLocalGenerator();

  const cmStateEnums::TargetType type = target->GetType();
  const std::string typeName = cmState::GetTargetTypeName(type);

  Json::Value ttl = Json::arrayValue;
  ttl.append("EXECUTABLE");
  ttl.append("STATIC_LIBRARY");
  ttl.append("SHARED_LIBRARY");
  ttl.append("MODULE_LIBRARY");
  ttl.append("OBJECT_LIBRARY");
  ttl.append("UTILITY");
  ttl.append("INTERFACE_LIBRARY");

  if (!hasString(ttl, typeName) || target->IsImported()) {
    return Json::Value();
  }

  Json::Value result = Json::objectValue;
  result[kNAME_KEY] = target->GetName();
  result[kIS_GENERATOR_PROVIDED_KEY] =
    target->Target->GetIsGeneratorProvided();
  result[kTYPE_KEY] = typeName;
  result[kSOURCE_DIRECTORY_KEY] = lg->GetCurrentSourceDirectory();
  result[kBUILD_DIRECTORY_KEY] = lg->GetCurrentBinaryDirectory();

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    return result;
  }

  result[kFULL_NAME_KEY] = target->GetFullName(config);

  if (target->Target->GetHaveInstallRule()) {
    result[kHAS_INSTALL_RULE] = true;

    Json::Value installPaths = Json::arrayValue;
    auto targetGenerators = target->Makefile->GetInstallGenerators();
    for (auto installGenerator : targetGenerators) {
      auto installTargetGenerator =
        dynamic_cast<cmInstallTargetGenerator*>(installGenerator);
      if (installTargetGenerator != nullptr &&
          installTargetGenerator->GetTarget()->Target == target->Target) {
        auto dest = installTargetGenerator->GetDestination(config);

        std::string installPath;
        if (!dest.empty() && cmSystemTools::FileIsFullPath(dest)) {
          installPath = dest;
        } else {
          std::string installPrefix =
            target->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
          installPath = installPrefix + '/' + dest;
        }

        installPaths.append(installPath);
      }
    }

    result[kINSTALL_PATHS] = installPaths;
  }

  if (target->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = Json::arrayValue;
    artifacts.append(
      target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact));
    if (target->IsDLLPlatform()) {
      artifacts.append(
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));
      const cmGeneratorTarget::OutputInfo* output =
        target->GetOutputInfo(config);
      if (output && !output->PdbDir.empty()) {
        artifacts.append(output->PdbDir + '/' + target->GetPDBName(config));
      }
    }
    result[kARTIFACTS_KEY] = artifacts;

    result[kLINKER_LANGUAGE_KEY] = target->GetLinkerLanguage(config);

    std::string linkLibs;
    std::string linkFlags;
    std::string linkLanguageFlags;
    std::string frameworkPath;
    std::string linkPath;
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, config, linkLibs, linkLanguageFlags,
                       linkFlags, frameworkPath, linkPath, target);

    linkLibs = cmSystemTools::TrimWhitespace(linkLibs);
    linkFlags = cmSystemTools::TrimWhitespace(linkFlags);
    linkLanguageFlags = cmSystemTools::TrimWhitespace(linkLanguageFlags);
    frameworkPath = cmSystemTools::TrimWhitespace(frameworkPath);
    linkPath = cmSystemTools::TrimWhitespace(linkPath);

    if (!cmSystemTools::TrimWhitespace(linkLibs).empty()) {
      result[kLINK_LIBRARIES_KEY] = linkLibs;
    }
    if (!cmSystemTools::TrimWhitespace(linkFlags).empty()) {
      result[kLINK_FLAGS_KEY] = linkFlags;
    }
    if (!cmSystemTools::TrimWhitespace(linkLanguageFlags).empty()) {
      result[kLINK_LANGUAGE_FLAGS_KEY] = linkLanguageFlags;
    }
    if (!frameworkPath.empty()) {
      result[kFRAMEWORK_PATH_KEY] = frameworkPath;
    }
    if (!linkPath.empty()) {
      result[kLINK_PATH_KEY] = linkPath;
    }
    const std::string sysroot =
      lg->GetMakefile()->GetSafeDefinition("CMAKE_SYSROOT");
    if (!sysroot.empty()) {
      result[kSYSROOT_KEY] = sysroot;
    }
  }

  std::set<std::string> languages;
  target->GetLanguages(languages, config);
  std::map<std::string, LanguageData> languageDataMap;

  for (std::string const& lang : languages) {
    LanguageData& ld = languageDataMap[lang];
    ld.Language = lang;
    lg->GetTargetCompileFlags(target, config, lang, ld.Flags);
    std::set<std::string> defines;
    lg->GetTargetDefines(target, config, lang, defines);
    ld.SetDefines(defines);
    std::vector<std::string> includePathList;
    lg->GetIncludeDirectories(includePathList, target, lang, config);
    for (std::string const& i : includePathList) {
      ld.IncludePathList.emplace_back(
        i, target->IsSystemIncludeDirectory(i, config, lang));
    }
  }

  Json::Value sourceGroupsValue =
    DumpSourceFilesList(target, config, languageDataMap);
  if (!sourceGroupsValue.empty()) {
    result[kFILE_GROUPS_KEY] = sourceGroupsValue;
  }

  return result;
}